

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

void __thiscall helics::MultiBroker::MultiBroker(MultiBroker *this,string_view brokerName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  CoreBroker *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  __integral_type in_stack_ffffffffffffffac;
  InterfaceTypes __i;
  atomic<int> *in_stack_ffffffffffffffb0;
  NetworkBrokerData *this_00;
  
  CoreBroker::CoreBroker(in_stack_00000060,(string_view)in_stack_00000068);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__MultiBroker_00a5c778;
  in_RDI->_M_string_length = (size_type)&PTR__MultiBroker_00a5c8d8;
  CLI::std::atomic<int>::atomic(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  __i = (InterfaceTypes)((uint)in_stack_ffffffffffffffac >> 0x18);
  this_00 = (NetworkBrokerData *)(in_RDI[0x73].field_2._M_local_buf + 8);
  CLI::std::
  vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  ::vector((vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
            *)0x1f14de);
  std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>::
  unique_ptr<std::default_delete<helics::CommsInterface>,void>
            ((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
             this_00);
  NetworkBrokerData::NetworkBrokerData(this_00,__i);
  std::__cxx11::string::string(in_RDI);
  CLI::std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)__i);
  *(undefined4 *)((long)&in_RDI[0x7d]._M_string_length + 4) = 0x2d;
  CLI::std::
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
  vector((vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
          *)0x1f154a);
  return;
}

Assistant:

MultiBroker::MultiBroker(std::string_view brokerName): CoreBroker(brokerName) {}